

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  runtime_error *prVar3;
  reference pvVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  int local_31c;
  undefined1 local_318 [8];
  JsonToken current;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  value_type local_2a0;
  allocator local_299;
  string local_298 [8];
  string arg;
  int local_274;
  undefined1 local_270 [4];
  int i;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
  types;
  string local_1c8 [32];
  istringstream local_1a8 [8];
  istringstream test;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Provide sufficient arguments");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c8,pcVar1,
             (allocator *)
             ((long)&types.c.
                     super__Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_node + 7));
  std::__cxx11::istringstream::istringstream(local_1a8,local_1c8,8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&types.c.
                     super__Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_node + 7));
  std::
  queue<json::JsonTokenType,std::deque<json::JsonTokenType,std::allocator<json::JsonTokenType>>>::
  queue<std::deque<json::JsonTokenType,std::allocator<json::JsonTokenType>>,void>
            ((queue<json::JsonTokenType,std::deque<json::JsonTokenType,std::allocator<json::JsonTokenType>>>
              *)&values.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)local_270);
  for (local_274 = 2; local_274 < argc; local_274 = local_274 + 2) {
    pcVar1 = argv[local_274];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,pcVar1,&local_299);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_298,"TYPE");
    if (bVar2) {
      pcVar1 = argv[(long)local_274 + 1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,pcVar1,&local_2c1);
      local_2a0 = std::__cxx11::stoi((string *)local_2c0,(size_t *)0x0,10);
      std::
      queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
      ::push((queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
              *)&values.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_2a0);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_298,"VALUE");
      if (!bVar2) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Invalid test arguments");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar1 = argv[(long)local_274 + 1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,pcVar1,(allocator *)&current.field_0x27);
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_270,(value_type *)local_2e8);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&current.field_0x27);
    }
    std::__cxx11::string::~string(local_298);
  }
  do {
    json::JsonLexer::nextToken((JsonToken *)local_318,(istream *)local_1a8);
    bVar2 = std::
            queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
            ::empty((queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
                     *)&values.c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if ((bVar2) ||
       (pvVar4 = std::
                 queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
                 ::front((queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
                          *)&values.c.
                             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node),
       *pvVar4 != local_318._0_4_)) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Wrong token type");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
    ::pop((queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
           *)&values.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (local_318._0_4_ == EndOfFile) {
      local_31c = 6;
    }
    else {
      if (local_318._0_4_ == Number) {
        bVar2 = std::
                queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_270);
        if (bVar2) {
LAB_00102a50:
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Wrong number value");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar5 = std::
                 queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::front((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_270);
        dVar6 = std::__cxx11::stod(pvVar5,(size_t *)0x0);
        dVar7 = std::__cxx11::stod((string *)&current,(size_t *)0x0);
        if ((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) goto LAB_00102a50;
        std::
        queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pop((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_270);
      }
      if (local_318._0_4_ == String) {
        bVar2 = std::
                queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_270);
        if (bVar2) {
LAB_00102b20:
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Wrong string value");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar5 = std::
                 queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::front((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_270);
        bVar2 = std::operator!=(pvVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&current);
        if (bVar2) goto LAB_00102b20;
        std::
        queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pop((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_270);
      }
      local_31c = 0;
    }
    json::JsonToken::~JsonToken((JsonToken *)local_318);
    if (local_31c != 0) {
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~queue((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_270);
      std::
      queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
      ::~queue((queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
                *)&values.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::__cxx11::istringstream::~istringstream(local_1a8);
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    if (argc < 3)
        throw std::runtime_error("Provide sufficient arguments");

    std::istringstream test(argv[1]);
    std::queue<JsonTokenType> types;
    std::queue<std::string> values;

    // Read the correct types and values the lexer should generate when reading the JSON text.
    for (int i = 2; i < argc; i += 2)
    {
        std::string arg = argv[i];
        if (arg == "TYPE")
        {
            types.push(static_cast<JsonTokenType>(std::stoi(argv[i + 1])));
        }
        else if (arg == "VALUE")
        {
            values.push(argv[i + 1]);
        }
        else
        {
            throw std::runtime_error("Invalid test arguments");
        }
    }

    while (true)
    {
        JsonToken current = JsonLexer::nextToken(test);

        // Check that the lexer generated the correct type.
        if (types.empty() || types.front() != current.type)
            throw std::runtime_error("Wrong token type");
        types.pop();

        if (current.type == JsonTokenType::EndOfFile)
            break;

        if (current.type == JsonTokenType::Number)
        {
            // Check that the lexer generated the correct number.
            if (values.empty() || std::stod(values.front()) != std::stod(current.value))
                throw std::runtime_error("Wrong number value");
            values.pop();
        }

        if (current.type == JsonTokenType::String)
        {
            // Check that the lexer generated the correct string.
            if (values.empty() || values.front() != current.value)
                throw std::runtime_error("Wrong string value");
            values.pop();
        }
    }

    return 0;
}